

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_relational_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue v;
  int iVar1;
  JSValueUnion JVar2;
  bool bVar3;
  JSValue val;
  JSValue JVar4;
  double d2;
  double d1;
  
  v = sp[-1];
  JVar4 = sp[-1];
  val = JS_ToPrimitiveFree(ctx,sp[-2],1);
  if ((val.tag & 0xffffffffU) != 6) {
    JVar4 = JS_ToPrimitiveFree(ctx,JVar4,1);
    v = val;
    if (((ulong)JVar4.tag & 0xffffffff) != 6) {
      if (((int)val.tag == -7) && ((int)JVar4.tag == -7)) {
        iVar1 = js_string_compare((JSContext *)val.u.ptr,(JSString *)JVar4.u.ptr,
                                  (JSString *)JVar4.tag);
        JS_FreeValue(ctx,val);
        JS_FreeValue(ctx,JVar4);
        if (op == OP_gt) {
          bVar3 = 0 < iVar1;
        }
        else if (op == OP_lte) {
          bVar3 = iVar1 < 1;
        }
        else if (op == OP_lt) {
          bVar3 = SUB41((uint)iVar1 >> 0x1f,0);
        }
        else {
          bVar3 = -1 < iVar1;
        }
        goto LAB_0013266d;
      }
      iVar1 = JS_ToFloat64Free(ctx,&d1,val);
      v = JVar4;
      if (iVar1 == 0) {
        iVar1 = JS_ToFloat64Free(ctx,&d2,JVar4);
        if (iVar1 != 0) goto LAB_00132546;
        if (op == OP_gt) {
          bVar3 = d1 < d2;
LAB_00132661:
          bVar3 = !bVar3 && d2 != d1;
        }
        else {
          if (op == OP_lte) {
            bVar3 = d2 < d1;
          }
          else {
            if (op == OP_lt) {
              bVar3 = d2 < d1;
              goto LAB_00132661;
            }
            bVar3 = d1 < d2;
          }
          bVar3 = !bVar3;
        }
LAB_0013266d:
        JVar2._1_7_ = 0;
        JVar2.int32._0_1_ = bVar3;
        sp[-2].u = JVar2;
        sp[-2].tag = 1;
        return 0;
      }
    }
  }
  JS_FreeValue(ctx,v);
LAB_00132546:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_relational_slow(JSContext *ctx, JSValue *sp,
                                        OPCodeEnum op)
{
    JSValue op1, op2;
    int res;

    op1 = sp[-2];
    op2 = sp[-1];
    op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NUMBER);
    if (JS_IsException(op1)) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NUMBER);
    if (JS_IsException(op2)) {
        JS_FreeValue(ctx, op1);
        goto exception;
    }
    if (JS_VALUE_GET_TAG(op1) == JS_TAG_STRING &&
        JS_VALUE_GET_TAG(op2) == JS_TAG_STRING) {
        JSString *p1, *p2;
        p1 = JS_VALUE_GET_STRING(op1);
        p2 = JS_VALUE_GET_STRING(op2);
        res = js_string_compare(ctx, p1, p2);
        JS_FreeValue(ctx, op1);
        JS_FreeValue(ctx, op2);
        switch(op) {
        case OP_lt:
            res = (res < 0);
            break;
        case OP_lte:
            res = (res <= 0);
            break;
        case OP_gt:
            res = (res > 0);
            break;
        default:
        case OP_gte:
            res = (res >= 0);
            break;
        }
    } else {
        double d1, d2;
        if (JS_ToFloat64Free(ctx, &d1, op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        if (JS_ToFloat64Free(ctx, &d2, op2))
            goto exception;
        switch(op) {
        case OP_lt:
            res = (d1 < d2); /* if NaN return false */
            break;
        case OP_lte:
            res = (d1 <= d2); /* if NaN return false */
            break;
        case OP_gt:
            res = (d1 > d2); /* if NaN return false */
            break;
        default:
        case OP_gte:
            res = (d1 >= d2); /* if NaN return false */
            break;
        }
    }
    sp[-2] = JS_NewBool(ctx, res);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}